

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

size_t __thiscall
axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
          (Array<char,_axl::sl::ArrayDetails<char>_> *this,size_t index,ValueArg e,size_t count)

{
  char *pcVar1;
  char *pcVar2;
  
  if (count != 0) {
    pcVar1 = insertSpace(this,index,count);
    if (pcVar1 == (char *)0x0) {
      return 0xffffffffffffffff;
    }
    pcVar2 = pcVar1 + count;
    for (; pcVar1 < pcVar2; pcVar1 = pcVar1 + 1) {
      *pcVar1 = e;
    }
  }
  return (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
}

Assistant:

size_t
	insert(
		size_t index,
		ValueArg e,
		size_t count = 1
	) {
		if (count == 0)
			return this->m_count;

		T* dst = insertSpace(index, count);
		if (!dst)
			return -1;

		T* end = dst + count;
		for (; dst < end; dst++)
			*dst = e;

		return this->m_count;
	}